

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O3

void __thiscall
iu_MatcherFailure_x_iutest_x_NanSensitiveDoubleEq_Test::Body
          (iu_MatcherFailure_x_iutest_x_NanSensitiveDoubleEq_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestFlag TVar2;
  TestPartResultReporterInterface *pTVar3;
  TestFlag *pTVar4;
  Variable *pVVar5;
  AssertionResult *in_R8;
  ScopedSPITestFlag guard;
  AssertionResult iutest_ar;
  AssertionResult iutest_spi_ar;
  SPIFailureChecker iutest_failure_checker;
  TestFlag local_43c;
  AssertionResult local_438;
  detail *local_410;
  long local_400 [2];
  string local_3f0;
  AssertionResult local_3d0;
  AssertionHelper local_3a8;
  SPIFailureChecker local_378;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base local_2c0 [264];
  undefined1 local_1b8 [32];
  char *local_198;
  undefined8 local_190;
  ios_base local_138 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c1e8;
  local_378.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_43c);
  local_340._0_8_ = &PTR__IMatcher_0023be28;
  local_340._8_8_ = 0x3ff0000000000000;
  iutest::detail::NanSensitiveFloatingPointEqMatcher<double>::operator()
            (&local_438,(NanSensitiveFloatingPointEqMatcher<double> *)local_340,
             &(anonymous_namespace)::d0);
  if (local_438.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::ostream::_M_insert<double>((anonymous_namespace)::d0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3f0,local_410,"NanSensitiveDoubleEq(1.0)",(char *)&local_438,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_3f0._M_dataplus._M_p,(allocator<char> *)local_340);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x1fe;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    if (local_410 != (detail *)local_400) {
      operator_delete(local_410,local_400[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.m_message._M_dataplus._M_p != &local_438.m_message.field_2) {
    operator_delete(local_438.m_message._M_dataplus._M_p,
                    local_438.m_message.field_2._M_allocated_capacity + 1);
  }
  TVar2.m_test_flags = local_43c.m_test_flags;
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = TVar2.m_test_flags;
  local_330[0]._M_allocated_capacity._0_4_ = 0x203a7145;
  local_340._8_8_ = 4;
  local_330[0]._M_allocated_capacity._4_4_ = local_330[0]._M_allocated_capacity._4_4_ & 0xffffff00;
  local_340._0_8_ = local_330;
  iutest::detail::SPIFailureChecker::GetResult(&local_3d0,&local_378,(string *)local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != local_330) {
    operator_delete((void *)local_340._0_8_,
                    CONCAT44(local_330[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_330[0]._M_allocated_capacity) + 1);
  }
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c268;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  pTVar3 = local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023c290;
  pVVar5 = iutest::TestEnv::get_vars();
  pVVar5->m_testpartresult_reporter = pTVar3;
  if (local_3d0.m_result == false) {
    memset((iu_global_format_stringstream *)local_340,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_3d0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_378);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_190 = 0x1000001fe;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_340,false);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  paVar1 = &local_3d0.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d0.m_message._M_dataplus._M_p,
                    local_3d0.m_message.field_2._M_allocated_capacity + 1);
  }
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector(&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c1e8;
  local_378.m_Type = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_43c);
  local_340._0_8_ = &PTR__IMatcher_0023be28;
  local_340._8_8_ = 0x3ff0000000000000;
  iutest::detail::NanSensitiveFloatingPointEqMatcher<double>::operator()
            (&local_438,(NanSensitiveFloatingPointEqMatcher<double> *)local_340,
             &(anonymous_namespace)::d0);
  if (local_438.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::ostream::_M_insert<double>((anonymous_namespace)::d0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_3f0,local_410,"NanSensitiveFloatingPointEq(1.0)",(char *)&local_438,in_R8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,local_3f0._M_dataplus._M_p,(allocator<char> *)local_340);
    local_3a8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
    ;
    local_3a8.m_part_result.super_iuCodeMessage.m_line = 0x1ff;
    local_3a8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3a8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3a8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_3a8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    if (local_410 != (detail *)local_400) {
      operator_delete(local_410,local_400[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.m_message._M_dataplus._M_p != &local_438.m_message.field_2) {
    operator_delete(local_438.m_message._M_dataplus._M_p,
                    local_438.m_message.field_2._M_allocated_capacity + 1);
  }
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = local_43c.m_test_flags;
  local_330[0]._M_allocated_capacity._0_4_ = 0x203a7145;
  local_340._8_8_ = 4;
  local_330[0]._M_allocated_capacity._4_4_ = local_330[0]._M_allocated_capacity._4_4_ & 0xffffff00;
  local_340._0_8_ = local_330;
  iutest::detail::SPIFailureChecker::GetResult(&local_3d0,&local_378,(string *)local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._0_8_ != local_330) {
    operator_delete((void *)local_340._0_8_,
                    CONCAT44(local_330[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_330[0]._M_allocated_capacity) + 1);
  }
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.super_NoTestPartResultReporter
  .super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface =
       (TestPartResultReporterInterface)&PTR__Collector_0023c268;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector
            (&local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results);
  local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder._vptr_ReporterHolder
       = (_func_int **)&PTR__ReporterHolder_0023c290;
  pVVar5 = iutest::TestEnv::get_vars();
  pVVar5->m_testpartresult_reporter =
       local_378.super_Collector<iutest::detail::NoTestPartResultReporter>.m_holder.m_origin;
  if (local_3d0.m_result == false) {
    memset((iu_global_format_stringstream *)local_340,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_340);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_3d0.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_378);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp";
    local_190 = 0x1000001ff;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_340,false);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
    std::ios_base::~ios_base(local_2c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_3d0.m_message._M_dataplus._M_p,
                    local_3d0.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(MatcherFailure, NanSensitiveDoubleEq)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT(d0, NanSensitiveDoubleEq(1.0)), "Eq: " );
    CHECK_FAILURE( IUTEST_ASSERT_THAT(d0, NanSensitiveFloatingPointEq(1.0)), "Eq: " );
}